

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_paeth_predictor_4x8_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  ulong uVar1;
  ulong uVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [16];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  int iVar17;
  bool bVar18;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar19 [16];
  short local_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  short sStack_70;
  short sStack_6e;
  short sStack_6c;
  short sStack_6a;
  __m128i l16;
  __m128i tl16;
  __m128i t16;
  
  uVar1 = *(ulong *)left;
  uVar2 = *(ulong *)above;
  auVar7._8_6_ = 0;
  auVar7._0_8_ = uVar2;
  auVar7[0xe] = (char)(uVar2 >> 0x38);
  auVar8._8_4_ = 0;
  auVar8._0_8_ = uVar2;
  auVar8[0xc] = (char)(uVar2 >> 0x30);
  auVar8._13_2_ = auVar7._13_2_;
  auVar9._8_4_ = 0;
  auVar9._0_8_ = uVar2;
  auVar9._12_3_ = auVar8._12_3_;
  auVar10._8_2_ = 0;
  auVar10._0_8_ = uVar2;
  auVar10[10] = (char)(uVar2 >> 0x28);
  auVar10._11_4_ = auVar9._11_4_;
  auVar11._8_2_ = 0;
  auVar11._0_8_ = uVar2;
  auVar11._10_5_ = auVar10._10_5_;
  auVar12[8] = (char)(uVar2 >> 0x20);
  auVar12._0_8_ = uVar2;
  auVar12._9_6_ = auVar11._9_6_;
  auVar14._7_8_ = 0;
  auVar14._0_7_ = auVar12._8_7_;
  auVar15._1_8_ = SUB158(auVar14 << 0x40,7);
  auVar15[0] = (char)(uVar2 >> 0x18);
  auVar15._9_6_ = 0;
  auVar16._1_10_ = SUB1510(auVar15 << 0x30,5);
  auVar16[0] = (char)(uVar2 >> 0x10);
  auVar16._11_4_ = 0;
  t16._3_12_ = SUB1512(auVar16 << 0x20,3);
  t16[0]._2_1_ = (char)(uVar2 >> 8);
  t16[0]._0_2_ = (ushort)(byte)uVar2;
  t16[1]._7_1_ = 0;
  auVar19 = pshuflw(ZEXT116(above[-1]),ZEXT116(above[-1]),0);
  tl16[0]._0_4_ = auVar19._0_4_;
  iVar17 = 8;
  auVar19 = _DAT_00b97a00;
  tl16[0]._4_4_ = (undefined4)tl16[0];
  tl16[1]._0_4_ = (undefined4)tl16[0];
  tl16[1]._4_4_ = (undefined4)tl16[0];
  while (bVar18 = iVar17 != 0, iVar17 = iVar17 + -1, bVar18) {
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar1;
    l16 = (__m128i)pshufb(auVar13,auVar19);
    paeth_8x1_pred(&l16,&t16,&tl16);
    local_78 = auVar19._0_2_;
    sStack_76 = auVar19._2_2_;
    sStack_74 = auVar19._4_2_;
    sStack_72 = auVar19._6_2_;
    sStack_70 = auVar19._8_2_;
    sStack_6e = auVar19._10_2_;
    sStack_6c = auVar19._12_2_;
    sStack_6a = auVar19._14_2_;
    sVar3 = (short)extraout_XMM0_Qa;
    sVar4 = (short)((ulong)extraout_XMM0_Qa >> 0x10);
    sVar5 = (short)((ulong)extraout_XMM0_Qa >> 0x20);
    sVar6 = (short)((ulong)extraout_XMM0_Qa >> 0x30);
    *(uint *)dst = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * (char)((ulong)extraout_XMM0_Qa >> 0x30)
                            - (0xff < sVar6),
                            CONCAT12((0 < sVar5) * (sVar5 < 0x100) *
                                     (char)((ulong)extraout_XMM0_Qa >> 0x20) - (0xff < sVar5),
                                     CONCAT11((0 < sVar4) * (sVar4 < 0x100) *
                                              (char)((ulong)extraout_XMM0_Qa >> 0x10) -
                                              (0xff < sVar4),
                                              (0 < sVar3) * (sVar3 < 0x100) * (char)extraout_XMM0_Qa
                                              - (0xff < sVar3))));
    dst = dst + stride;
    auVar19._0_2_ = local_78 + 1;
    auVar19._2_2_ = sStack_76 + 1;
    auVar19._4_2_ = sStack_74 + 1;
    auVar19._6_2_ = sStack_72 + 1;
    auVar19._8_2_ = sStack_70 + 1;
    auVar19._10_2_ = sStack_6e + 1;
    auVar19._12_2_ = sStack_6c + 1;
    auVar19._14_2_ = sStack_6a + 1;
  }
  return;
}

Assistant:

void aom_paeth_predictor_4x8_ssse3(uint8_t *dst, ptrdiff_t stride,
                                   const uint8_t *above, const uint8_t *left) {
  __m128i l = _mm_loadl_epi64((const __m128i *)left);
  const __m128i t = _mm_loadl_epi64((const __m128i *)above);
  const __m128i zero = _mm_setzero_si128();
  const __m128i t16 = _mm_unpacklo_epi8(t, zero);
  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  __m128i rep = _mm_set1_epi16((short)0x8000);
  const __m128i one = _mm_set1_epi16(1);

  int i;
  for (i = 0; i < 8; ++i) {
    const __m128i l16 = _mm_shuffle_epi8(l, rep);
    const __m128i row = paeth_8x1_pred(&l16, &t16, &tl16);

    *(int *)dst = _mm_cvtsi128_si32(_mm_packus_epi16(row, row));
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }
}